

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tsqueue.h
# Opt level: O0

message<MsgType> * __thiscall
blcl::net::tsqueue<blcl::net::message<MsgType>_>::pop_front
          (message<MsgType> *__return_storage_ptr__,tsqueue<blcl::net::message<MsgType>_> *this)

{
  reference pvVar1;
  scoped_lock<std::mutex> local_20;
  scoped_lock<std::mutex> lock;
  tsqueue<blcl::net::message<MsgType>_> *this_local;
  type *t;
  
  lock._M_device = (mutex_type *)this;
  std::scoped_lock<std::mutex>::scoped_lock(&local_20,&this->queue_mtx_);
  pvVar1 = std::deque<blcl::net::message<MsgType>,_std::allocator<blcl::net::message<MsgType>_>_>::
           front(&this->raw_deque_);
  message<MsgType>::message(__return_storage_ptr__,pvVar1);
  std::deque<blcl::net::message<MsgType>,_std::allocator<blcl::net::message<MsgType>_>_>::pop_front
            (&this->raw_deque_);
  std::scoped_lock<std::mutex>::~scoped_lock(&local_20);
  return __return_storage_ptr__;
}

Assistant:

T pop_front() {
            std::scoped_lock lock(queue_mtx_);
            auto t = std::move(raw_deque_.front());
            raw_deque_.pop_front();
            return t;
        }